

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_should_not_parse_to_deeply_nested_jsons(void)

{
  size_t position;
  long lVar1;
  cJSON *pcVar2;
  long in_FS_OFFSET;
  char deep_json [1001];
  char local_3f8 [1008];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar1 = 0; lVar1 != 0x3e9; lVar1 = lVar1 + 1) {
    local_3f8[lVar1] = '[';
  }
  local_3f8[1000] = 0;
  pcVar2 = cJSON_Parse(local_3f8);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail("To deep JSONs should not be parsed.",0xc5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_should_not_parse_to_deeply_nested_jsons(void)
{
    char deep_json[CJSON_NESTING_LIMIT + 1];
    size_t position = 0;

    for (position = 0; position < sizeof(deep_json); position++)
    {
        deep_json[position] = '[';
    }
    deep_json[sizeof(deep_json) - 1] = '\0';

    TEST_ASSERT_NULL_MESSAGE(cJSON_Parse(deep_json), "To deep JSONs should not be parsed.");
}